

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value.cpp
# Opt level: O3

basic_ostream<char,_std::char_traits<char>_> * __thiscall
pstore::dump::object::writer<std::ostream,pstore::dump::object_char_traits>
          (object *this,basic_ostream<char,_std::char_traits<char>_> *os,indent *ind,
          object_char_traits *traits)

{
  basic_ostream<char,_std::char_traits<char>_> *pbVar1;
  
  if (writer<std::ostream,pstore::dump::object_char_traits>(std::ostream&,pstore::dump::indent_const&,pstore::dump::object_char_traits_const&)
      ::strings == '\0') {
    writer<std::ostream,pstore::dump::object_char_traits>();
  }
  if ((this->compact_ == false) &&
     ((this->members_).
      super__Vector_base<pstore::dump::object::member,_std::allocator<pstore::dump::object::member>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      (this->members_).
      super__Vector_base<pstore::dump::object::member,_std::allocator<pstore::dump::object::member>_>
      ._M_impl.super__Vector_impl_data._M_start)) {
    pbVar1 = write_full_size<std::ostream,pstore::dump::object_char_traits>
                       (this,os,ind,
                        &writer<std::basic_ostream<char,_std::char_traits<char>_>,_pstore::dump::object_char_traits>
                         ::strings);
    return pbVar1;
  }
  pbVar1 = write_compact<std::ostream,pstore::dump::object_char_traits>
                     (this,os,&writer<std::basic_ostream<char,_std::char_traits<char>_>,_pstore::dump::object_char_traits>
                               ::strings);
  return pbVar1;
}

Assistant:

OStream & object::writer (OStream & os, indent const & ind,
                                  ObjectCharacterTraits const & traits) const {
            static_assert (
                std::is_same<typename OStream::char_type,
                             typename ObjectCharacterTraits::char_type>::value,
                "Object character traits char_type does not match stream character type");
            static object_strings<ObjectCharacterTraits> const strings{traits};

            bool const is_compact = compact_ || members_.size () == 0;
            if (is_compact) {
                return this->write_compact (os, strings);
            }
            return this->write_full_size (os, ind, strings);
        }